

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtDbvt.cpp
# Opt level: O1

void __thiscall cbtDbvt::update(cbtDbvt *this,cbtDbvtNode *leaf,int lookahead)

{
  cbtDbvtNode *pcVar1;
  cbtDbvtNode *root;
  
  root = removeleaf(this,leaf);
  if (root == (cbtDbvtNode *)0x0) {
    root = (cbtDbvtNode *)0x0;
  }
  else if (lookahead < 0) {
    root = this->m_root;
  }
  else if (lookahead != 0) {
    do {
      pcVar1 = root->parent;
      if (pcVar1 == (cbtDbvtNode *)0x0) break;
      lookahead = lookahead + -1;
      root = pcVar1;
    } while (lookahead != 0);
  }
  insertleaf(this,root,leaf);
  return;
}

Assistant:

void cbtDbvt::update(cbtDbvtNode* leaf, int lookahead)
{
	cbtDbvtNode* root = removeleaf(this, leaf);
	if (root)
	{
		if (lookahead >= 0)
		{
			for (int i = 0; (i < lookahead) && root->parent; ++i)
			{
				root = root->parent;
			}
		}
		else
			root = m_root;
	}
	insertleaf(this, root, leaf);
}